

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_80;
  undefined1 local_70 [8];
  string syntax;
  Token syntax_token;
  Parser *this_local;
  
  bVar1 = Consume(this,"syntax","File must begin with \'syntax = \"proto2\";\'.");
  if (bVar1) {
    bVar1 = Consume(this,"=");
    if (bVar1) {
      pTVar2 = io::Tokenizer::current(this->input_);
      io::Tokenizer::Token::Token((Token *)((long)&syntax.field_2 + 8),pTVar2);
      std::__cxx11::string::string((string *)local_70);
      bVar1 = ConsumeString(this,(string *)local_70,"Expected syntax identifier.");
      if (bVar1) {
        bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&this->syntax_identifier_,(string *)local_70);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_70,"proto2");
          if ((bVar1) && ((this->stop_after_syntax_identifier_ & 1U) == 0)) {
            std::operator+(&local_c0,"Unrecognized syntax identifier \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70);
            std::operator+(&local_a0,&local_c0,"\".  This parser only recognizes \"proto2\".");
            AddError(this,syntax_token.text.field_2._8_4_,syntax_token.text.field_2._12_4_,&local_a0
                    );
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      local_80 = 1;
      std::__cxx11::string::~string((string *)local_70);
      io::Tokenizer::Token::~Token((Token *)((long)&syntax.field_2 + 8));
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseSyntaxIdentifier() {
  DO(Consume("syntax", "File must begin with 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", NULL));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
      "Unrecognized syntax identifier \"" + syntax + "\".  This parser "
      "only recognizes \"proto2\".");
    return false;
  }

  return true;
}